

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O1

bool Assimp::Blender::read<Assimp::Blender::MVert>
               (Structure *s,MVert *p,size_t cnt,FileDatabase *db)

{
  float *pfVar1;
  MVert read;
  MVert local_68;
  
  if (cnt != 0) {
    pfVar1 = p->co;
    do {
      local_68.super_ElemBase.dna_type = (char *)0x0;
      local_68.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_00830b50;
      local_68._40_4_ = local_68._40_4_ & 0xffffff00;
      local_68.mat_nr = 0;
      local_68.bweight = 0;
      Structure::Convert<Assimp::Blender::MVert>(s,&local_68,db);
      *(char **)(pfVar1 + -2) = local_68.super_ElemBase.dna_type;
      *(undefined8 *)pfVar1 = local_68.co._0_8_;
      *(undefined8 *)(pfVar1 + 2) = local_68._24_8_;
      *(undefined8 *)(pfVar1 + 4) = local_68.no._4_8_;
      *(ulong *)(pfVar1 + 6) = CONCAT44(local_68.mat_nr,local_68._40_4_);
      pfVar1[8] = (float)local_68.bweight;
      pfVar1 = pfVar1 + 0xe;
      cnt = cnt - 1;
    } while (cnt != 0);
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }